

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

Vector * __thiscall
KDIS::DATA_TYPE::Vector::operator*(Vector *__return_storage_ptr__,Vector *this,KFLOAT64 Value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  KFLOAT32 KVar3;
  Vector *tmp;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00215678;
  KVar3 = this->m_f32Y;
  __return_storage_ptr__->m_f32X = this->m_f32X;
  __return_storage_ptr__->m_f32Y = KVar3;
  __return_storage_ptr__->m_f32Z = this->m_f32Z;
  uVar1 = __return_storage_ptr__->m_f32X;
  uVar2 = __return_storage_ptr__->m_f32Y;
  __return_storage_ptr__->m_f32X = (KFLOAT32)(float)((double)Value * (double)(float)uVar1);
  __return_storage_ptr__->m_f32Y = (KFLOAT32)(float)((double)Value * (double)(float)uVar2);
  __return_storage_ptr__->m_f32Z =
       (KFLOAT32)(float)((double)(float)__return_storage_ptr__->m_f32Z * (double)Value);
  return __return_storage_ptr__;
}

Assistant:

Vector Vector::operator * ( KFLOAT64 Value ) const
{
    Vector tmp = *this;
    tmp.m_f32X *= Value;
    tmp.m_f32Y *= Value;
    tmp.m_f32Z *= Value;
    return tmp;
}